

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::EventLoop::run(EventLoop *this,uint maxTurnCount)

{
  bool bVar1;
  uint local_34;
  Type TStack_30;
  uint i;
  undefined1 local_28 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1797:3)>
  _kjDefer1797;
  uint maxTurnCount_local;
  EventLoop *this_local;
  
  this->running = true;
  TStack_30.this = this;
  _kjDefer1797.maybeFunc.ptr.field_1._4_4_ = maxTurnCount;
  defer<kj::EventLoop::run(unsigned_int)::__0>((kj *)local_28,&stack0xffffffffffffffd0);
  local_34 = 0;
  while ((local_34 < (uint)_kjDefer1797.maybeFunc.ptr.field_1._4_4_ && (bVar1 = turn(this), bVar1)))
  {
    local_34 = local_34 + 1;
  }
  bVar1 = isRunnable(this);
  setRunnable(this,bVar1);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1797:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1797:3)>
               *)local_28);
  return;
}

Assistant:

void EventLoop::run(uint maxTurnCount) {
  running = true;
  KJ_DEFER(running = false);

  for (uint i = 0; i < maxTurnCount; i++) {
    if (!turn()) {
      break;
    }
  }

  setRunnable(isRunnable());
}